

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

void __thiscall icu_63::CalendarAstronomer::clearCache(CalendarAstronomer *this)

{
  double dVar1;
  
  dVar1 = uprv_getNaN_63();
  this->julianDay = dVar1;
  this->julianCentury = dVar1;
  this->sunLongitude = dVar1;
  this->meanAnomalySun = dVar1;
  this->moonLongitude = dVar1;
  this->moonEclipLong = dVar1;
  this->meanAnomalyMoon = dVar1;
  this->eclipObliquity = dVar1;
  this->siderealTime = dVar1;
  this->siderealT0 = dVar1;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

void CalendarAstronomer::clearCache() {
    const double INVALID = uprv_getNaN();

    julianDay       = INVALID;
    julianCentury   = INVALID;
    sunLongitude    = INVALID;
    meanAnomalySun  = INVALID;
    moonLongitude   = INVALID;
    moonEclipLong   = INVALID;
    meanAnomalyMoon = INVALID;
    eclipObliquity  = INVALID;
    siderealTime    = INVALID;
    siderealT0      = INVALID;
    moonPositionSet = FALSE;
}